

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O2

bool __thiscall lexical::analyse_char(lexical *this,iterator *it,Meta *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *ch;
  byte bVar6;
  int local_b4;
  Token t;
  string buf;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  char local_40 [16];
  
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  ch = it->_M_current;
  iVar5 = 0;
  local_b4 = 0;
  bVar6 = 0;
  do {
    if (ch == (m->end)._M_current) {
LAB_0010cf0e:
      bVar3 = false;
LAB_0010cf10:
      std::__cxx11::string::~string((string *)&buf);
      return bVar3;
    }
    switch(bVar6) {
    case 0:
      bVar6 = 1;
      break;
    case 1:
      cVar2 = *ch;
      std::__cxx11::string::push_back((char)&buf);
      bVar6 = cVar2 == '\\' | 2;
      break;
    case 2:
      bVar6 = 6;
      if (*ch != '\'') {
        std::__cxx11::string::string((string *)&t,anon_var_dwarf_2bbb6,(allocator *)local_58);
        error(this,it,m,(string *)&t);
LAB_0010cf04:
        std::__cxx11::string::~string((string *)&t);
        goto LAB_0010cf0e;
      }
      break;
    case 3:
      std::__cxx11::string::push_back((char)&buf);
      bVar3 = Table::in_escape_chars(&this->table,it->_M_current);
      if (bVar3) goto LAB_0010cd6e;
      if (*it->_M_current != 'u') {
        bVar3 = sutil::is_octal(it->_M_current);
        if (bVar3) {
          it->_M_current = it->_M_current + -1;
          std::__cxx11::string::pop_back();
          goto LAB_0010cd8c;
        }
        std::__cxx11::string::string((string *)&t,anon_var_dwarf_2bbcd,(allocator *)local_58);
        error(this,it,m,(string *)&t);
        goto LAB_0010cf04;
      }
      bVar6 = 4;
      break;
    case 4:
      if (3 < iVar5) {
        it->_M_current = ch + -1;
        iVar5 = iVar5 + 1;
        goto LAB_0010cd6e;
      }
      iVar4 = isxdigit((int)*ch);
      if (iVar4 == 0) {
        std::__cxx11::string::string((string *)&t,anon_var_dwarf_2bbd8,(allocator *)local_58);
        error(this,it,m,(string *)&t);
        goto LAB_0010cf04;
      }
      std::__cxx11::string::push_back((char)&buf);
      bVar6 = 4;
      iVar5 = iVar5 + 1;
      break;
    case 5:
      if (local_b4 < 3) {
        bVar3 = sutil::is_octal(ch);
        if (bVar3) {
          std::__cxx11::string::push_back((char)&buf);
          local_b4 = local_b4 + 1;
LAB_0010cd8c:
          bVar6 = 5;
          break;
        }
        if (local_b4 == 0) {
          std::__cxx11::string::string((string *)&t,anon_var_dwarf_2bbef,(allocator *)local_58);
          error(this,it,m,(string *)&t);
          goto LAB_0010cf04;
        }
        it->_M_current = it->_M_current + -1;
      }
      else {
        it->_M_current = ch + -1;
      }
LAB_0010cd6e:
      bVar6 = 2;
      break;
    case 6:
      Token::Token(&t,m->line,m->column,7,&buf);
      std::vector<Token,_std::allocator<Token>_>::push_back(&this->tokens,&t);
      paVar1 = &t.name.field_2;
      local_50._M_p = local_40;
      local_58._0_4_ = t.type;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)t.name._M_dataplus._M_p == paVar1) {
        local_40[8] = t.name.field_2._8_1_;
        local_40[9] = t.name.field_2._9_1_;
        local_40[10] = t.name.field_2._10_1_;
        local_40[0xb] = t.name.field_2._11_1_;
        local_40[0xc] = t.name.field_2._12_1_;
        local_40[0xd] = t.name.field_2._13_1_;
        local_40[0xe] = t.name.field_2._14_1_;
        local_40[0xf] = t.name.field_2._15_1_;
      }
      else {
        local_50._M_p = t.name._M_dataplus._M_p;
      }
      local_48 = t.name._M_string_length;
      t.name._M_string_length = 0;
      t.name.field_2._M_local_buf[0] = '\0';
      t.name._M_dataplus._M_p = (pointer)paVar1;
      std::
      _Rb_tree<Symbol,_Symbol,_std::_Identity<Symbol>,_std::less<Symbol>,_std::allocator<Symbol>_>::
      _M_insert_unique<Symbol>(&(this->symbols)._M_t,(Symbol *)local_58);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&t.name);
      bVar3 = true;
      goto LAB_0010cf10;
    }
    ch = it->_M_current + 1;
    it->_M_current = ch;
  } while( true );
}

Assistant:

bool lexical::analyse_char(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;
    int countU = 0;
    int countO = 0;
    while (it != m.end) {
        switch (state) {
            case 0: {
                state = 1;
                break;
            }
            case 1: {
                if (*it == '\\')
                    state = 3;
                else
                    state = 2;
                buf.push_back(*it);
                break;
            }
                //分析普通字符
            case 2: {
                if (*it != '\'') {
                    error(it, m, "非法的字符结尾");
                    return false;
                }
                state = 6;
                break;
            }
                //分析普通转义字符
            case 3: {
                buf.push_back(*it);
                if (table.in_escape_chars(*it)) {
                    state = 2;
                } else if (*it == 'u') {
                    state = 4;
                } else if (sutil::is_octal(*it)) {
                    state = 5;
                    --it;
                    buf.pop_back();
                } else {
                    error(it, m, "非法的转义字符");
                    return false;
                }
                break;
            }
                // 分析\uFFFF
            case 4: {
                if (countU++ < 4) {
                    if (isxdigit(*it))buf.push_back(*it);
                    else {
                        error(it, m, "unicode表示法需要4位16进制数");
                        return false;
                    }
                } else {
                    --it;
                    state = 2;
                }
                break;
            }
                //分析 \八进制*3
            case 5: {
                if (countO < 3) {
                    if (sutil::is_octal(*it)) {
                        ++countO;
                        buf.push_back(*it);
                    } else if (countO != 0) {
                        --it;
                        state = 2;
                    } else {
                        error(it, m, "八进制字符需要1-3位八进制数");
                        return false;
                    }
                } else {
                    --it;
                    state = 2;
                }
                break;
            }
            case 6: {
                Token t(m.line, m.column, Token::CHAR, buf);
                tokens.push_back(t);
                symbols.insert(Symbol(t.type, t.name));
                return true;
            }
        }
        ++it;
    }
    return false;
}